

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

jsparser_ctx * ctemplate_htmlparser::jsparser_duplicate(jsparser_ctx *src)

{
  jsparser_ctx *dst;
  
  if (src != (jsparser_ctx *)0x0) {
    dst = jsparser_new();
    if (dst != (jsparser_ctx *)0x0) {
      jsparser_copy(dst,src);
    }
    return dst;
  }
  __assert_fail("src != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,600,"jsparser_ctx *ctemplate_htmlparser::jsparser_duplicate(jsparser_ctx *)");
}

Assistant:

jsparser_ctx *jsparser_duplicate(jsparser_ctx *src)
{
  jsparser_ctx *dst;
  assert(src != NULL);

  dst = jsparser_new();
  if (dst == NULL)
    return NULL;

  jsparser_copy(dst, src);

  return dst;
}